

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::GetLengthPrefixedSlice(char *p,char *limit,Slice *result)

{
  char *pcVar1;
  char *pcVar2;
  uint32_t len;
  uint local_1c;
  
  pcVar1 = GetVarint32Ptr(p,limit,&local_1c);
  pcVar2 = pcVar1 + local_1c;
  if (limit < pcVar2 || pcVar1 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    result->data_ = pcVar1;
    result->size_ = (ulong)local_1c;
  }
  return pcVar2;
}

Assistant:

const char* GetLengthPrefixedSlice(const char* p, const char* limit,
                                   Slice* result) {
  uint32_t len;
  p = GetVarint32Ptr(p, limit, &len);
  if (p == nullptr) return nullptr;
  if (p + len > limit) return nullptr;
  *result = Slice(p, len);
  return p + len;
}